

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
visitShortCircuitOp(AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                    *this,BinaryExpression *expr)

{
  BinaryExpression *in_RSI;
  Expression *in_RDI;
  Expression *in_stack_00000030;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_00000038;
  type falseState;
  type trueState;
  DataFlowState *in_stack_fffffffffffffd68;
  DataFlowState *in_stack_fffffffffffffd70;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffd88;
  DataFlowState local_218;
  DataFlowState *in_stack_fffffffffffffe90;
  DataFlowState *in_stack_fffffffffffffe98;
  DataFlowAnalysis *in_stack_fffffffffffffea0;
  DataFlowState *in_stack_fffffffffffffef8;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_ffffffffffffff00;
  
  slang::ast::BinaryExpression::left(in_RSI);
  visitCondition(in_stack_fffffffffffffd88,in_RDI);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9c98f3);
  DataFlowState::DataFlowState(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  DataFlowState::DataFlowState(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  DataFlowState::DataFlowState(&local_218,in_stack_fffffffffffffd68);
  setState(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  DataFlowState::~DataFlowState((DataFlowState *)0x9c9986);
  slang::ast::BinaryExpression::right(in_RSI);
  visitCondition(in_stack_fffffffffffffd88,in_RDI);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9c99b8);
  if (in_RSI->op == LogicalOr) {
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  else if (in_RSI->op == LogicalAnd) {
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  else {
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  adjustConditionalState(in_stack_00000038,in_stack_00000030);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9c9a95);
  DataFlowState::~DataFlowState((DataFlowState *)0x9c9aa2);
  DataFlowState::~DataFlowState((DataFlowState *)0x9c9aaf);
  return;
}

Assistant:

void visitShortCircuitOp(const BinaryExpression& expr) {
        // Visit the LHS -- after this the state is guaranteed to be split.
        visitCondition(expr.left());

        // The state when visiting the RHS depends on the operator;
        // for logical OR we know we won't visit the RHS unless the
        // LHS is false, so we can set the state to the false state.
        // The opposite is true for logical AND and implication.
        auto trueState = std::move(stateWhenTrue), falseState = std::move(stateWhenFalse);
        setState(expr.op == BinaryOperator::LogicalOr ? std::move(falseState)
                                                      : std::move(trueState));
        visitCondition(expr.right());

        // Join the states from the two branches. For example,
        // for logical OR, we only got here if the LHS was false
        // so we join the true state with the true state after visiting
        // the RHS, since either being true leads to the same outcome.
        if (expr.op == BinaryOperator::LogicalOr)
            (DERIVED).joinState(stateWhenTrue, trueState);
        else if (expr.op == BinaryOperator::LogicalAnd)
            (DERIVED).joinState(stateWhenFalse, falseState);
        else {
            // Reminder that logical implication (a -> b) is
            // equivalent to (!a || b)
            SLANG_ASSERT(expr.op == BinaryOperator::LogicalImplication);
            (DERIVED).joinState(stateWhenTrue, falseState);
        }

        // Allow the full binary operator to set a constant
        // state if the full expression is constant.
        adjustConditionalState(expr);
    }